

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

void __thiscall SpriteBase::create(SpriteBase *this,size_t w,size_t h)

{
  uint8_t *puVar1;
  size_t h_local;
  size_t w_local;
  SpriteBase *this_local;
  
  if (this->data != (uint8_t *)0x0) {
    if (this->data != (uint8_t *)0x0) {
      operator_delete__(this->data);
    }
    this->data = (uint8_t *)0x0;
  }
  this->width = w;
  this->height = h;
  puVar1 = (uint8_t *)operator_new__(this->width * this->height * 4);
  this->data = puVar1;
  return;
}

Assistant:

void
SpriteBase::create(size_t w, size_t h) {
  if (data != nullptr) {
    delete[] data;
    data = nullptr;
  }

  width = w;
  height = h;
  data =  new uint8_t[width * height * 4];
}